

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.h
# Opt level: O2

void __thiscall
std::pair<const_Kumu::UUID,_Kumu::UUID>::pair
          (pair<const_Kumu::UUID,_Kumu::UUID> *this,pair<const_Kumu::UUID,_Kumu::UUID> *param_2)

{
  undefined8 uVar1;
  
  (this->first).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00168d38;
  (this->first).super_Identifier<16U>.m_HasValue = (param_2->first).super_Identifier<16U>.m_HasValue
  ;
  uVar1 = *(undefined8 *)((param_2->first).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->first).super_Identifier<16U>.m_Value =
       *(undefined8 *)(param_2->first).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->first).super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->first).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00169290;
  (this->second).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00168d38;
  (this->second).super_Identifier<16U>.m_HasValue =
       (param_2->second).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((param_2->second).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->second).super_Identifier<16U>.m_Value =
       *(undefined8 *)(param_2->second).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->second).super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->second).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00169290;
  return;
}

Assistant:

Identifier(const Identifier& rhs) : IArchive() {
	m_HasValue = rhs.m_HasValue;
	memcpy(m_Value, rhs.m_Value, SIZE);
      }